

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

QString * __thiscall
QSQLiteDriver::escapeIdentifier
          (QString *__return_storage_ptr__,QSQLiteDriver *this,QString *identifier,
          IdentifierType type)

{
  char16_t cVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long lVar4;
  char cVar5;
  qsizetype qVar6;
  long lVar7;
  long lVar8;
  char16_t *pcVar9;
  char16_t *pcVar10;
  long in_FS_OFFSET;
  QStringView local_b8;
  QStringView local_a8;
  QStringView local_98;
  QStringView local_88;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
  local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((identifier->d).size == 0) ||
     (cVar5 = (**(code **)(*(long *)this + 0xf0))(this,identifier,type), cVar5 != '\0')) {
    pDVar2 = (identifier->d).d;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = (identifier->d).ptr;
    (__return_storage_ptr__->d).size = (identifier->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00116217;
  }
  local_70.a.a.a.a.a.b = (QStringView *)(identifier->d).ptr;
  local_70.a.a.a.a.a.a = (QStringView *)(identifier->d).size;
  qVar6 = QStringView::indexOf((QStringView *)&local_70,(QChar)0x2e,0,CaseSensitive);
  if (-1 < qVar6) {
    pcVar3 = (identifier->d).ptr;
    lVar4 = (identifier->d).size;
    lVar8 = lVar4 - (qVar6 + 1);
    local_a8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    pcVar10 = L"\"";
    pcVar9 = L"\"";
    if (2 < qVar6) {
      cVar1 = *pcVar3;
      if (cVar1 == L'`') {
        if (pcVar3[qVar6 + -1] == L'`') {
LAB_001160e0:
          pcVar9 = L"";
        }
        else {
          pcVar9 = L"\"";
        }
      }
      else if (cVar1 == L'[') {
        pcVar9 = L"\"";
        if (pcVar3[qVar6 + -1] == L']') {
          pcVar9 = L"";
        }
      }
      else {
        pcVar9 = L"\"";
        if (cVar1 == L'\"') {
          if (pcVar3[qVar6 + -1] == L'\"') goto LAB_001160e0;
          pcVar9 = L"\"";
        }
      }
    }
    local_98.m_size = lVar8;
    local_98.m_data = pcVar3 + qVar6 + 1;
    local_88.m_size = qVar6;
    local_88.m_data = pcVar3;
    lVar7 = QtPrivate::qustrlen(pcVar9);
    local_b8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.m_data = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
    if (2 < lVar8) {
      cVar1 = pcVar3[qVar6 + 1];
      if (cVar1 == L'`') {
        if (pcVar3[lVar4 + -1] == L'`') {
LAB_00116170:
          pcVar10 = L"";
        }
      }
      else if (cVar1 == L'[') {
        pcVar10 = L"\"";
        if (pcVar3[lVar4 + -1] == L']') {
          pcVar10 = L"";
        }
      }
      else if ((cVar1 == L'\"') && (pcVar3[lVar4 + -1] == L'\"')) goto LAB_00116170;
    }
    local_a8.m_size = lVar7;
    local_a8.m_data = pcVar9;
    local_b8.m_size = QtPrivate::qustrlen(pcVar10);
    local_b8.m_data = pcVar10;
    if ((lVar7 == 0) || (local_b8.m_size == 0)) {
      local_70.a.a.a.a.a.a = &local_a8;
      local_70.a.a.a.a.a.b = &local_88;
      local_70.a.a.a.b = L'.';
      local_70.a.a.b = &local_b8;
      local_70.a.b = &local_98;
      local_70.a.a.a.a.b = local_70.a.a.a.a.a.a;
      local_70.b = local_70.a.a.b;
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
      ::convertTo<QString>(__return_storage_ptr__,&local_70);
      goto LAB_00116217;
    }
  }
  local_70.a.a.a.a.a.a = (QStringView *)CONCAT62(local_70.a.a.a.a.a.a._2_6_,0x22);
  local_70.a.a.a.a.b = (QStringView *)CONCAT62(local_70.a.a.a.a.b._2_6_,0x22);
  local_70.a.a.a.a.a.b = (QStringView *)identifier;
  QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t>::convertTo<QString>
            (__return_storage_ptr__,
             (QStringBuilder<QStringBuilder<char16_t,_const_QString_&>,_char16_t> *)&local_70);
LAB_00116217:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSQLiteDriver::escapeIdentifier(const QString &identifier, IdentifierType type) const
{
    Q_D(const QSQLiteDriver);
    if (identifier.isEmpty() || isIdentifierEscaped(identifier, type))
        return identifier;

    const auto indexOfSeparator = identifier.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{identifier}.first(indexOfSeparator);
        auto rightName = QStringView{identifier}.sliced(indexOfSeparator + 1);
        const QStringView leftEnclose = d->isIdentifierEscaped(leftName) ? u"" : u"\"";
        const QStringView rightEnclose = d->isIdentifierEscaped(rightName) ? u"" : u"\"";
        if (leftEnclose.isEmpty() || rightEnclose.isEmpty())
            return (leftEnclose + leftName + leftEnclose + u'.' + rightEnclose + rightName
                    + rightEnclose);
    }
    return u'"' + identifier + u'"';
}